

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_chmod(sftp_command *cmd)

{
  char cVar1;
  char *__s;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  uint local_40;
  int action;
  uint perms;
  uint subset;
  char *modebegin;
  sftp_context_chmod ctx [1];
  int ret;
  int i;
  char *mode;
  sftp_command *cmd_local;
  
  if (backend == (Backend *)0x0) {
    not_connected();
    cmd_local._4_4_ = 0;
  }
  else if (cmd->nwords < 3) {
    printf("chmod: expects a mode specifier and a filename\n");
    cmd_local._4_4_ = 0;
  }
  else {
    modebegin._4_4_ = 0;
    modebegin._0_4_ = 0;
    _ret = cmd->words[1];
    if ((*_ret < '0') || ('9' < *_ret)) {
      while (__s = _ret, *_ret != '\0') {
        action = 0;
        while( true ) {
          bVar5 = false;
          if ((((*_ret != '\0') && (bVar5 = false, *_ret != ',')) && (bVar5 = false, *_ret != '+'))
             && (bVar5 = false, *_ret != '-')) {
            bVar5 = *_ret != '=';
          }
          if (!bVar5) break;
          switch(*_ret) {
          case 'a':
            action = 0xdff;
            break;
          default:
            sVar3 = strcspn(__s,",");
            printf("chmod: file mode \'%.*s\' contains unrecognised user/group/other specifier \'%c\'\n"
                   ,sVar3 & 0xffffffff,__s,(ulong)(uint)(int)*_ret);
            return 0;
          case 'g':
            action = action | 0x438;
            break;
          case 'o':
            action = action | 7;
            break;
          case 'u':
            action = action | 0x9c0;
          }
          _ret = _ret + 1;
        }
        if ((*_ret == '\0') || (*_ret == ',')) {
          sVar3 = strcspn(__s,",");
          printf("chmod: file mode \'%.*s\' is incomplete\n",sVar3 & 0xffffffff,__s);
          return 0;
        }
        pcVar4 = _ret + 1;
        cVar1 = *_ret;
        if ((*pcVar4 == '\0') || (*pcVar4 == ',')) {
          sVar3 = strcspn(__s,",");
          printf("chmod: file mode \'%.*s\' is incomplete\n",sVar3 & 0xffffffff,__s);
          return 0;
        }
        local_40 = 0;
        _ret = pcVar4;
        while( true ) {
          bVar5 = false;
          if (*_ret != '\0') {
            bVar5 = *_ret != ',';
          }
          if (!bVar5) break;
          switch(*_ret) {
          case 'r':
            local_40 = local_40 | 0x124;
            break;
          case 's':
            if (((action & 0xdffU) != 0x9c0) && ((action & 0xdffU) != 0x438)) {
              sVar3 = strcspn(__s,",");
              printf("chmod: file mode \'%.*s\': set[ug]id bit should be used with exactly one of u or g only\n"
                     ,sVar3 & 0xffffffff,__s);
              return 0;
            }
            local_40 = local_40 | 0xc00;
            break;
          case 't':
            local_40 = local_40 | 0x200;
            action = action | 0x200;
            break;
          default:
            sVar3 = strcspn(__s,",");
            printf("chmod: file mode \'%.*s\' contains unrecognised permission specifier \'%c\'\n",
                   sVar3 & 0xffffffff,__s,(ulong)(uint)(int)*_ret);
            return 0;
          case 'w':
            local_40 = local_40 | 0x92;
            break;
          case 'x':
            local_40 = local_40 | 0x49;
          }
          _ret = _ret + 1;
        }
        if (((action & 0xdffU) == 0) && ((local_40 & (action ^ 0xffffffffU)) != 0)) {
          sVar3 = strcspn(__s,",");
          printf("chmod: file mode \'%.*s\' contains no user/group/other specifier and permissions other than \'t\' \n"
                 ,sVar3 & 0xffffffff,__s);
          return 0;
        }
        local_40 = local_40 & action;
        if (cVar1 == '+') {
          modebegin._0_4_ = local_40 | (uint)modebegin;
          modebegin._4_4_ = local_40 | modebegin._4_4_;
        }
        else if (cVar1 == '-') {
          modebegin._0_4_ = local_40 | (uint)modebegin;
          modebegin._4_4_ = (local_40 ^ 0xffffffff) & modebegin._4_4_;
        }
        else if (cVar1 == '=') {
          modebegin._0_4_ = action | (uint)modebegin;
          modebegin._4_4_ = local_40 | modebegin._4_4_;
        }
        if (*_ret != '\0') {
          _ret = _ret + 1;
        }
      }
    }
    else {
      sVar3 = strspn(_ret,"01234567");
      if (_ret[sVar3] != '\0') {
        printf("chmod: numeric file modes should contain digits 0-7 only\n");
        return 0;
      }
      modebegin._0_4_ = 0xfff;
      __isoc99_sscanf(_ret,"%o",(long)&modebegin + 4);
      modebegin._4_4_ = (uint)modebegin & modebegin._4_4_;
    }
    ctx[0].attrs_clr = 1;
    for (ctx[0].attrs_xor = 2; (ulong)(long)(int)ctx[0].attrs_xor < cmd->nwords;
        ctx[0].attrs_xor = ctx[0].attrs_xor + 1) {
      _Var2 = wildcard_iterate(cmd->words[(int)ctx[0].attrs_xor],sftp_action_chmod,&modebegin);
      ctx[0].attrs_clr = _Var2 & ctx[0].attrs_clr;
    }
    cmd_local._4_4_ = ctx[0].attrs_clr;
  }
  return cmd_local._4_4_;
}

Assistant:

int sftp_cmd_chmod(struct sftp_command *cmd)
{
    char *mode;
    int i, ret;
    struct sftp_context_chmod ctx[1];

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("chmod: expects a mode specifier and a filename\n");
        return 0;
    }

    /*
     * Attempt to parse the mode specifier in cmd->words[1]. We
     * don't support the full horror of Unix chmod; instead we
     * support a much simpler syntax in which the user can either
     * specify an octal number, or a comma-separated sequence of
     * [ugoa]*[-+=][rwxst]+. (The initial [ugoa] sequence may
     * _only_ be omitted if the only attribute mentioned is t,
     * since all others require a user/group/other specification.
     * Additionally, the s attribute may not be specified for any
     * [ugoa] specifications other than exactly u or exactly g.
     */
    ctx->attrs_clr = ctx->attrs_xor = 0;
    mode = cmd->words[1];
    if (mode[0] >= '0' && mode[0] <= '9') {
        if (mode[strspn(mode, "01234567")]) {
            printf("chmod: numeric file modes should"
                   " contain digits 0-7 only\n");
            return 0;
        }
        ctx->attrs_clr = 07777;
        sscanf(mode, "%o", &ctx->attrs_xor);
        ctx->attrs_xor &= ctx->attrs_clr;
    } else {
        while (*mode) {
            char *modebegin = mode;
            unsigned subset, perms;
            int action;

            subset = 0;
            while (*mode && *mode != ',' &&
                   *mode != '+' && *mode != '-' && *mode != '=') {
                switch (*mode) {
                  case 'u': subset |= 04700; break; /* setuid, user perms */
                  case 'g': subset |= 02070; break; /* setgid, group perms */
                  case 'o': subset |= 00007; break; /* just other perms */
                  case 'a': subset |= 06777; break; /* all of the above */
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " user/group/other specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            action = *mode++;
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms = 0;
            while (*mode && *mode != ',') {
                switch (*mode) {
                  case 'r': perms |= 00444; break;
                  case 'w': perms |= 00222; break;
                  case 'x': perms |= 00111; break;
                  case 't': perms |= 01000; subset |= 01000; break;
                  case 's':
                    if ((subset & 06777) != 04700 &&
                        (subset & 06777) != 02070) {
                        printf("chmod: file mode '%.*s': set[ug]id bit should"
                               " be used with exactly one of u or g only\n",
                               (int)strcspn(modebegin, ","), modebegin);
                        return 0;
                    }
                    perms |= 06000;
                    break;
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " permission specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!(subset & 06777) && (perms &~ subset)) {
                printf("chmod: file mode '%.*s' contains no user/group/other"
                       " specifier and permissions other than 't' \n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms &= subset;
            switch (action) {
              case '+':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor |= perms;
                break;
              case '-':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor &= ~perms;
                break;
              case '=':
                ctx->attrs_clr |= subset;
                ctx->attrs_xor |= perms;
                break;
            }
            if (*mode) mode++;         /* eat comma */
        }
    }

    ret = 1;
    for (i = 2; i < cmd->nwords; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_chmod, ctx);

    return ret;
}